

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O1

Status * __thiscall
draco::PlyDecoder::DecodeFromBuffer
          (Status *__return_storage_ptr__,PlyDecoder *this,DecoderBuffer *buffer,Mesh *out_mesh)

{
  this->out_mesh_ = out_mesh;
  this->out_point_cloud_ = &out_mesh->super_PointCloud;
  DecoderBuffer::Init(&this->buffer_,buffer->data_ + buffer->pos_,buffer->data_size_ - buffer->pos_)
  ;
  DecodeInternal(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Status PlyDecoder::DecodeFromBuffer(DecoderBuffer *buffer, Mesh *out_mesh) {
  out_mesh_ = out_mesh;
  return DecodeFromBuffer(buffer, static_cast<PointCloud *>(out_mesh));
}